

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_insert_multiple_string_key(planck_unit_test_t *tc)

{
  ulong uVar1;
  int iVar2;
  ion_dictionary_t dict;
  char key [9];
  ion_dictionary_handler_t handler;
  int local_ac;
  ion_dictionary_t local_a8;
  char local_90 [16];
  ion_dictionary_handler_t local_80;
  
  local_90[8] = 0;
  local_90[0] = '\0';
  local_90[1] = '\0';
  local_90[2] = '\0';
  local_90[3] = '\0';
  local_90[4] = '\0';
  local_90[5] = '\0';
  local_90[6] = '\0';
  local_90[7] = '\0';
  bhdct_setup_string_key(tc,&local_80,&local_a8,ion_fill_none);
  uVar1 = 0x32;
  iVar2 = 100;
  do {
    sprintf(local_90,"k%d",uVar1);
    local_ac = iVar2;
    bhdct_insert(tc,&local_a8,local_90,&local_ac,'\0');
    uVar1 = (ulong)((int)uVar1 + 1);
    iVar2 = iVar2 + 2;
  } while (iVar2 != 0x6e);
  bhdct_delete_dictionary(tc,&local_a8);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_insert_multiple_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 50; i < 55; i++) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_insert(tc, &dict, key, IONIZE(i * 2, int), boolean_false);
	}

	bhdct_takedown(tc, &dict);
}